

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

void __thiscall
CharFieldSourceByteArray::CharFieldSourceByteArray(CharFieldSourceByteArray *this,vm_obj_id_t id)

{
  CVmObjPageEntry *pCVar1;
  
  (this->super_CharFieldSource)._vptr_CharFieldSource = (_func_int **)&PTR__CharFieldSource_0031ee50
  ;
  pCVar1 = G_obj_table_X.pages_[id >> 0xc];
  this->arr = (CVmObjByteArray *)(pCVar1 + (id & 0xfff));
  this->idx = 0;
  this->len = (ulong)**(uint **)((long)&pCVar1[id & 0xfff].ptr_ + 8);
  return;
}

Assistant:

CharFieldSourceByteArray(VMG_ vm_obj_id_t id)
    {
        arr = (CVmObjByteArray *)vm_objp(vmg_ id);
        idx = 0;
        len = arr->get_element_count();
    }